

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void RAWToRGB24Row_C(uint8_t *src_raw,uint8_t *dst_rgb24,int width)

{
  uint8_t uVar1;
  uint8_t uVar2;
  long lVar3;
  
  if (0 < width) {
    lVar3 = 0;
    do {
      uVar1 = src_raw[lVar3];
      uVar2 = src_raw[lVar3 + 1];
      dst_rgb24[lVar3] = src_raw[lVar3 + 2];
      dst_rgb24[lVar3 + 1] = uVar2;
      dst_rgb24[lVar3 + 2] = uVar1;
      lVar3 = lVar3 + 3;
      width = width + -1;
    } while (width != 0);
  }
  return;
}

Assistant:

void RAWToRGB24Row_C(const uint8_t* src_raw, uint8_t* dst_rgb24, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t r = src_raw[0];
    uint8_t g = src_raw[1];
    uint8_t b = src_raw[2];
    dst_rgb24[0] = b;
    dst_rgb24[1] = g;
    dst_rgb24[2] = r;
    dst_rgb24 += 3;
    src_raw += 3;
  }
}